

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O2

int catenate(Global *global,ReturnCode *ret)

{
  char cVar1;
  char *__s;
  int iVar2;
  uint c_00;
  ReturnCode RVar3;
  char *__src;
  size_t sVar4;
  size_t sVar5;
  ushort **ppuVar6;
  int c;
  
  iVar2 = get(global);
  if (iVar2 == 0x1e) {
    __src = savestring(global,global->tokenbuf);
    c_00 = get(global);
    c = c_00;
    if (global->rightconcat == '\0') {
      lookid(global,c_00);
    }
    else {
      RVar3 = macroid(global,&c);
      *ret = RVar3;
      c_00 = c;
      if (RVar3 != FPP_OK) goto LAB_00105b71;
    }
    cVar1 = type[(int)c_00];
    if ((cVar1 == '\x01') || (cVar1 == 'B')) {
      strcpy(global->work,__src);
      sVar4 = strlen(global->work);
      global->workp = global->work + sVar4;
      RVar3 = scannumber(global,c_00,save);
      *ret = RVar3;
      if (RVar3 != FPP_OK) goto LAB_00105b71;
      RVar3 = save(global,0);
      *ret = RVar3;
      if (RVar3 != FPP_OK) {
        return 0;
      }
    }
    else if (cVar1 == '\x02') {
      sVar4 = strlen(__src);
      __s = global->tokenbuf;
      sVar5 = strlen(__s);
      if (0x1ff < (int)sVar5 + (int)sVar4) {
        cerror(global,FATAL_WORK_AREA_OVERFLOW,__src);
        *ret = FPP_WORK_AREA_OVERFLOW;
        return 0;
      }
      sprintf(global->work,"%s%s",__src,__s);
    }
    else {
      ppuVar6 = __ctype_b_loc();
      cerror(global,ERROR_STRANG_CHARACTER2 - (((*ppuVar6)[(int)c_00] >> 0xe & 1) != 0),(ulong)c_00)
      ;
      strcpy(global->work,__src);
      unget(global);
    }
    Free(__src);
    RVar3 = ungetstring(global,global->work);
    *ret = RVar3;
    RVar3 = RVar3 ^ FPP_OUT_OF_MEMORY;
  }
  else {
    unget(global);
LAB_00105b71:
    RVar3 = FPP_OK;
  }
  return RVar3;
}

Assistant:

int catenate(struct Global *global, ReturnCode *ret)
{
  /*
   * A token was just read (via macroid).
   * If the next character is TOK_SEP, concatenate the next token
   * return TRUE -- which should recall macroid after refreshing
   * macroid's argument.  If it is not TOK_SEP, unget() the character
   * and return FALSE.
   */

#if OK_CONCAT
  int c;
  char *token1;
#endif
  
#if OK_CONCAT
  if (get(global) != TOK_SEP) {                 /* Token concatenation  */
    unget(global);
    return (FALSE);
  }
  else {
    token1 = savestring(global, global->tokenbuf); /* Save first token     */
    c=get(global);
    if(global->rightconcat) {
      *ret=macroid(global, &c);           /* Scan next token      */
      if(*ret)
	return(FALSE);
    } else
      lookid(global, c);
    switch(type[c]) {                   /* What was it?         */
    case LET:				/* An identifier, ...	*/
      if ((int)strlen(token1) + (int)strlen(global->tokenbuf) >= NWORK) {
	cfatal(global, FATAL_WORK_AREA_OVERFLOW, token1);
	*ret=FPP_WORK_AREA_OVERFLOW;
	return(FALSE);
      }
      sprintf(global->work, "%s%s", token1, global->tokenbuf);
      break;
    case DIG:				/* A number		*/
    case DOT:				/* Or maybe a float	*/
      strcpy(global->work, token1);
      global->workp = global->work + strlen(global->work);
      *ret=scannumber(global, c, save);
      if(*ret)
	return(FALSE);
      *ret=save(global, EOS);
      if(*ret)
	return(FALSE);
      break;
    default:				/* An error, ...	*/
      if (isprint(c))
	cerror(global, ERROR_STRANG_CHARACTER, c);
      else
	cerror(global, ERROR_STRANG_CHARACTER2, c);
      strcpy(global->work, token1);
      unget(global);
      break;
    }
    /*
     * work has the concatenated token and token1 has
     * the first token (no longer needed).  Unget the
     * new (concatenated) token after freeing token1.
     * Finally, setup to read the new token.
     */
    Freemem(token1);                        /* Free up memory       */
    *ret=ungetstring(global, global->work);  /* Unget the new thing, */
    if(*ret)
      return(FALSE);
    return(TRUE);
  }
#else
  return(FALSE);                    /* Not supported        */
#endif
}